

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1parse.c
# Opt level: O0

FT_Error T1_New_Parser(T1_Parser parser,FT_Stream stream,FT_Memory memory,PSAux_Service psaux)

{
  uchar *puVar1;
  FT_Alloc_Func local_38;
  FT_ULong size;
  FT_UShort tag;
  PSAux_Service pPStack_28;
  FT_Error error;
  PSAux_Service psaux_local;
  FT_Memory memory_local;
  FT_Stream stream_local;
  T1_Parser parser_local;
  
  pPStack_28 = psaux;
  psaux_local = (PSAux_Service)memory;
  memory_local = (FT_Memory)stream;
  stream_local = (FT_Stream)parser;
  (*psaux->ps_parser_funcs->init)(&parser->root,(FT_Byte *)0x0,(FT_Byte *)0x0,memory);
  stream_local[1].cursor = (uchar *)memory_local;
  stream_local[2].base = (uchar *)0x0;
  stream_local[1].limit = (uchar *)0x0;
  stream_local[2].pos = 0;
  stream_local[2].size = 0;
  *(undefined1 *)&stream_local[2].descriptor = 0;
  *(undefined1 *)((long)&stream_local[2].descriptor + 1) = 0;
  *(undefined1 *)((long)&stream_local[2].descriptor + 2) = 0;
  size._4_4_ = check_type1_format((FT_Stream)memory_local,"%!PS-AdobeFont",0xe);
  if (size._4_4_ != 0) {
    if (((size._4_4_ & 0xff) != 2) ||
       (size._4_4_ = check_type1_format((FT_Stream)memory_local,"%!FontType",10), size._4_4_ != 0))
    goto LAB_0034dade;
    size._4_4_ = 0;
  }
  size._4_4_ = FT_Stream_Seek((FT_Stream)memory_local,0);
  if ((size._4_4_ == 0) &&
     (size._4_4_ = read_pfb_tag((FT_Stream)memory_local,(FT_UShort *)((long)&size + 2),
                                (FT_ULong *)&local_38), size._4_4_ == 0)) {
    if (size._2_2_ == -0x7fff) {
      *(undefined1 *)&stream_local[2].descriptor = 1;
    }
    else {
      size._4_4_ = FT_Stream_Seek((FT_Stream)memory_local,0);
      if (size._4_4_ != 0) goto LAB_0034dade;
      local_38 = memory_local->alloc;
    }
    if (memory_local[1].alloc == (FT_Alloc_Func)0x0) {
      stream_local[1].limit = (uchar *)(memory_local->free + (long)memory_local->user);
      stream_local[2].base = (uchar *)local_38;
      *(undefined1 *)((long)&stream_local[2].descriptor + 1) = 1;
      size._4_4_ = FT_Stream_Skip((FT_Stream)memory_local,(FT_Long)local_38);
      if (size._4_4_ != 0) goto LAB_0034dade;
    }
    else {
      puVar1 = (uchar *)ft_mem_alloc((FT_Memory)psaux_local,(FT_Long)local_38,
                                     (FT_Error *)((long)&size + 4));
      stream_local[1].limit = puVar1;
      if ((size._4_4_ != 0) ||
         (size._4_4_ = FT_Stream_Read((FT_Stream)memory_local,stream_local[1].limit,
                                      (FT_ULong)local_38), size._4_4_ != 0)) goto LAB_0034dade;
      stream_local[2].base = (uchar *)local_38;
    }
    stream_local->size = (unsigned_long)stream_local[1].limit;
    stream_local->base = stream_local[1].limit;
    stream_local->pos = (unsigned_long)(stream_local->base + (long)stream_local[2].base);
  }
LAB_0034dade:
  if ((size._4_4_ != 0) && (*(char *)((long)&stream_local[2].descriptor + 1) == '\0')) {
    ft_mem_free((FT_Memory)psaux_local,stream_local[1].limit);
    stream_local[1].limit = (uchar *)0x0;
  }
  return size._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_New_Parser( T1_Parser      parser,
                 FT_Stream      stream,
                 FT_Memory      memory,
                 PSAux_Service  psaux )
  {
    FT_Error   error;
    FT_UShort  tag;
    FT_ULong   size;


    psaux->ps_parser_funcs->init( &parser->root, NULL, NULL, memory );

    parser->stream       = stream;
    parser->base_len     = 0;
    parser->base_dict    = NULL;
    parser->private_len  = 0;
    parser->private_dict = NULL;
    parser->in_pfb       = 0;
    parser->in_memory    = 0;
    parser->single_block = 0;

    /* check the header format */
    error = check_type1_format( stream, "%!PS-AdobeFont", 14 );
    if ( error )
    {
      if ( FT_ERR_NEQ( error, Unknown_File_Format ) )
        goto Exit;

      error = check_type1_format( stream, "%!FontType", 10 );
      if ( error )
      {
        FT_TRACE2(( "  not a Type 1 font\n" ));
        goto Exit;
      }
    }

    /******************************************************************/
    /*                                                                */
    /* Here a short summary of what is going on:                      */
    /*                                                                */
    /*   When creating a new Type 1 parser, we try to locate and load */
    /*   the base dictionary if this is possible (i.e., for PFB       */
    /*   files).  Otherwise, we load the whole font into memory.      */
    /*                                                                */
    /*   When `loading' the base dictionary, we only setup pointers   */
    /*   in the case of a memory-based stream.  Otherwise, we         */
    /*   allocate and load the base dictionary in it.                 */
    /*                                                                */
    /*   parser->in_pfb is set if we are in a binary (`.pfb') font.   */
    /*   parser->in_memory is set if we have a memory stream.         */
    /*                                                                */

    /* try to compute the size of the base dictionary;     */
    /* look for a Postscript binary file tag, i.e., 0x8001 */
    if ( FT_STREAM_SEEK( 0L ) )
      goto Exit;

    error = read_pfb_tag( stream, &tag, &size );
    if ( error )
      goto Exit;

    if ( tag != 0x8001U )
    {
      /* assume that this is a PFA file for now; an error will */
      /* be produced later when more things are checked        */
      if ( FT_STREAM_SEEK( 0L ) )
        goto Exit;
      size = stream->size;
    }
    else
      parser->in_pfb = 1;

    /* now, try to load `size' bytes of the `base' dictionary we */
    /* found previously                                          */

    /* if it is a memory-based resource, set up pointers */
    if ( !stream->read )
    {
      parser->base_dict = (FT_Byte*)stream->base + stream->pos;
      parser->base_len  = size;
      parser->in_memory = 1;

      /* check that the `size' field is valid */
      if ( FT_STREAM_SKIP( size ) )
        goto Exit;
    }
    else
    {
      /* read segment in memory -- this is clumsy, but so does the format */
      if ( FT_ALLOC( parser->base_dict, size )       ||
           FT_STREAM_READ( parser->base_dict, size ) )
        goto Exit;
      parser->base_len = size;
    }

    parser->root.base   = parser->base_dict;
    parser->root.cursor = parser->base_dict;
    parser->root.limit  = parser->root.cursor + parser->base_len;

  Exit:
    if ( error && !parser->in_memory )
      FT_FREE( parser->base_dict );

    return error;
  }